

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib576.c
# Opt level: O0

int test(char *URL)

{
  undefined1 local_24 [8];
  chunk_data_t chunk_data;
  CURLcode res;
  CURL *handle;
  char *URL_local;
  
  stack0xffffffffffffffe8 = 0;
  chunk_data.remains = 0;
  memset(local_24,0,8);
  curl_global_init(3);
  register0x00000000 = curl_easy_init();
  if (register0x00000000 == 0) {
    chunk_data.remains = 0x1b;
  }
  else {
    chunk_data.remains = curl_easy_setopt(register0x00000000,0x2712,URL);
    if ((((chunk_data.remains == 0) &&
         (chunk_data.remains = curl_easy_setopt(stack0xffffffffffffffe8,0xc5,1),
         chunk_data.remains == 0)) &&
        (chunk_data.remains = curl_easy_setopt(stack0xffffffffffffffe8,0x4ee6,chunk_bgn),
        chunk_data.remains == 0)) &&
       ((chunk_data.remains = curl_easy_setopt(stack0xffffffffffffffe8,0x4ee7,chunk_end),
        chunk_data.remains == 0 &&
        (chunk_data.remains = curl_easy_setopt(stack0xffffffffffffffe8,0x27d9,local_24),
        chunk_data.remains == 0)))) {
      chunk_data.remains = curl_easy_perform(stack0xffffffffffffffe8);
    }
  }
  if (stack0xffffffffffffffe8 != 0) {
    curl_easy_cleanup(stack0xffffffffffffffe8);
  }
  curl_global_cleanup();
  return chunk_data.remains;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLcode res = CURLE_OK;
  chunk_data_t chunk_data = {0, 0};
  curl_global_init(CURL_GLOBAL_ALL);
  handle = curl_easy_init();
  if(!handle) {
    res = CURLE_OUT_OF_MEMORY;
    goto test_cleanup;
  }

  test_setopt(handle, CURLOPT_URL, URL);
  test_setopt(handle, CURLOPT_WILDCARDMATCH, 1L);
  test_setopt(handle, CURLOPT_CHUNK_BGN_FUNCTION, chunk_bgn);
  test_setopt(handle, CURLOPT_CHUNK_END_FUNCTION, chunk_end);
  test_setopt(handle, CURLOPT_CHUNK_DATA, &chunk_data);

  res = curl_easy_perform(handle);

test_cleanup:
  if(handle)
    curl_easy_cleanup(handle);
  curl_global_cleanup();
  return res;
}